

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thecl06.c
# Opt level: O0

void th06_dump(thecl_t *ecl,FILE *out)

{
  uint uVar1;
  thecl_instr_type tVar2;
  thecl_sub_t *sub_00;
  thecl_instr_t *ptVar3;
  long lVar4;
  thecl_param_t *ptVar5;
  bool bVar6;
  uint uVar7;
  char *pcVar8;
  seqmap_entry_t *psVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  char *pcVar16;
  char *ret_1;
  list_node_t *node_5;
  thecl_param_t *local_b0;
  int first_1;
  seqmap_entry_t *ent_1;
  list_node_t *node_4;
  uint time_last_1;
  thecl_instr_t *instr_1;
  list_node_t *node_3;
  thecl_timeline_t *timeline;
  char *ret;
  list_node_t *node_2;
  int first;
  thecl_param_t *param;
  seqmap_entry_t *ent;
  list_node_t *node_1;
  uint time_last;
  thecl_instr_t *instr;
  list_node_t *node;
  thecl_sub_t *sub;
  FILE *out_local;
  thecl_t *ecl_local;
  
  if ((ecl != (thecl_t *)0x0) && (out != (FILE *)0x0)) {
    for (instr = (thecl_instr_t *)(ecl->subs).head; instr != (thecl_instr_t *)0x0;
        instr = *(thecl_instr_t **)instr) {
      sub_00 = *(thecl_sub_t **)&instr->id;
      fprintf((FILE *)out,"\nsub %s()\n{\n",sub_00->name);
      node_1._4_4_ = 0;
      for (ent = (seqmap_entry_t *)(sub_00->instrs).head; ent != (seqmap_entry_t *)0x0;
          ent = *(seqmap_entry_t **)ent) {
        ptVar3 = *(thecl_instr_t **)(ent + 1);
        switch(ptVar3->type) {
        case THECL_INSTR_INSTR:
          if ((g_ecl_hexdebug & 1U) == 0) {
            fprintf((FILE *)out,"    ");
          }
          else {
            fprintf((FILE *)out,"    /* %5x (+%5x) */ ",(ulong)ptVar3->address,(ulong)ptVar3->offset
                   );
          }
          psVar9 = seqmap_get(g_eclmap->ins_names,ptVar3->id);
          if (psVar9 == (seqmap_entry_t *)0x0) {
            fprintf((FILE *)out,"ins_%u(",(ulong)ptVar3->id);
          }
          else {
            fprintf((FILE *)out,"%s(",psVar9->value);
          }
          bVar6 = true;
          for (ret = (char *)(ptVar3->params).head; ret != (char *)0x0; ret = *(char **)ret) {
            ptVar5 = *(thecl_param_t **)(ret + 0x10);
            if (bVar6) {
              bVar6 = false;
            }
            else {
              fprintf((FILE *)out,", ");
            }
            pcVar11 = th06_stringify_param(sub_00,ptVar3,ptVar5,ecl->version);
            fprintf((FILE *)out,"%s",pcVar11);
            free(pcVar11);
          }
          fprintf((FILE *)out,");\n");
          break;
        case THECL_INSTR_TIME:
          fprintf((FILE *)out,"+%u: //%u\n",(ulong)(ptVar3->time - node_1._4_4_),(ulong)ptVar3->time
                 );
          node_1._4_4_ = ptVar3->time;
          break;
        case THECL_INSTR_RANK:
          if (ptVar3->rank == 0xff) {
            fprintf((FILE *)out,"!*");
          }
          else {
            uVar1 = ptVar3->rank;
            uVar7 = get_default_none_rank(ecl->version);
            if (uVar1 == uVar7) {
              fprintf((FILE *)out,"!-");
            }
            else {
              pcVar11 = "";
              if ((ptVar3->rank & 1) != 0) {
                pcVar11 = "E";
              }
              pcVar10 = "";
              if ((ptVar3->rank & 2) != 0) {
                pcVar10 = "N";
              }
              pcVar13 = "";
              if ((ptVar3->rank & 4) != 0) {
                pcVar13 = "H";
              }
              pcVar14 = "";
              if ((ptVar3->rank & 8) != 0) {
                pcVar14 = "L";
              }
              pcVar12 = "";
              if ((ptVar3->rank & 0x10) == 0) {
                pcVar12 = "4";
              }
              pcVar16 = "";
              if ((ptVar3->rank & 0x20) == 0) {
                pcVar16 = "5";
              }
              pcVar15 = "";
              if ((ptVar3->rank & 0x40) == 0) {
                pcVar15 = "6";
              }
              pcVar8 = "";
              if ((ptVar3->rank & 0x80) == 0) {
                pcVar8 = "7";
              }
              fprintf((FILE *)out,"!%s%s%s%s%s%s%s%s",pcVar11,pcVar10,pcVar13,pcVar14,pcVar12,
                      pcVar16,pcVar15,pcVar8);
            }
          }
          break;
        case THECL_INSTR_LABEL:
          fprintf((FILE *)out,"%s_%u:\n",sub_00->name,(ulong)ptVar3->offset);
          break;
        default:
          abort();
        }
      }
      fprintf((FILE *)out,"}\n");
    }
    for (instr_1 = (thecl_instr_t *)(ecl->timelines).head; instr_1 != (thecl_instr_t *)0x0;
        instr_1 = *(thecl_instr_t **)instr_1) {
      lVar4 = *(long *)&instr_1->id;
      fprintf((FILE *)out,"\ntimeline %s()\n{\n",lVar4);
      node_4._4_4_ = 0;
      for (ent_1 = *(seqmap_entry_t **)(lVar4 + 0x100); ent_1 != (seqmap_entry_t *)0x0;
          ent_1 = *(seqmap_entry_t **)ent_1) {
        ptVar3 = *(thecl_instr_t **)(ent_1 + 1);
        tVar2 = ptVar3->type;
        if (tVar2 == THECL_INSTR_INSTR) {
          psVar9 = seqmap_get(g_eclmap->timeline_ins_names,ptVar3->id);
          if (psVar9 == (seqmap_entry_t *)0x0) {
            fprintf((FILE *)out,"    ins_%u(",(ulong)ptVar3->id);
          }
          else {
            fprintf((FILE *)out,"    %s(",psVar9->value);
          }
          bVar6 = true;
          for (ret_1 = (char *)(ptVar3->params).head; ret_1 != (char *)0x0; ret_1 = *(char **)ret_1)
          {
            ptVar5 = *(thecl_param_t **)(ret_1 + 0x10);
            if (bVar6) {
              bVar6 = false;
            }
            else {
              fprintf((FILE *)out,", ");
            }
            pcVar11 = th06_stringify_param((thecl_sub_t *)0x0,ptVar3,ptVar5,ecl->version);
            fprintf((FILE *)out,"%s",pcVar11);
            free(pcVar11);
          }
          fprintf((FILE *)out,");\n");
        }
        else if (tVar2 == THECL_INSTR_TIME) {
          if (ptVar3->time == 0xffff) {
            fprintf((FILE *)out,"%u:\n",(ulong)ptVar3->time);
          }
          else {
            fprintf((FILE *)out,"+%u: //%u\n",(ulong)(ptVar3->time - node_4._4_4_),
                    (ulong)ptVar3->time);
          }
          node_4._4_4_ = ptVar3->time;
        }
        else {
          if (tVar2 != THECL_INSTR_RANK) {
            abort();
          }
          if (ptVar3->rank == 0xff) {
            fprintf((FILE *)out,"!*\n");
          }
          else if (ptVar3->rank == 0xf0) {
            fprintf((FILE *)out,"!-\n");
          }
          else {
            pcVar11 = "";
            if ((ptVar3->rank & 1) != 0) {
              pcVar11 = "E";
            }
            pcVar10 = "";
            if ((ptVar3->rank & 2) != 0) {
              pcVar10 = "N";
            }
            pcVar13 = "";
            if ((ptVar3->rank & 4) != 0) {
              pcVar13 = "H";
            }
            pcVar14 = "";
            if ((ptVar3->rank & 8) != 0) {
              pcVar14 = "L";
            }
            pcVar12 = "";
            if ((ptVar3->rank & 0x10) == 0) {
              pcVar12 = "4";
            }
            pcVar16 = "";
            if ((ptVar3->rank & 0x20) == 0) {
              pcVar16 = "5";
            }
            pcVar15 = "";
            if ((ptVar3->rank & 0x40) == 0) {
              pcVar15 = "6";
            }
            pcVar8 = "";
            if ((ptVar3->rank & 0x80) == 0) {
              pcVar8 = "7";
            }
            fprintf((FILE *)out,"!%s%s%s%s%s%s%s%s\n",pcVar11,pcVar10,pcVar13,pcVar14,pcVar12,
                    pcVar16,pcVar15,pcVar8);
          }
        }
      }
      fprintf((FILE *)out,"}\n");
    }
  }
  return;
}

Assistant:

static void
th06_dump(
    const thecl_t* ecl,
    FILE* out)
{
    if (!ecl || !out)
        return;

    thecl_sub_t* sub;
    list_for_each(&ecl->subs, sub) {
        fprintf(out, "\nsub %s()\n{\n", sub->name);

        thecl_instr_t* instr;
        unsigned int time_last = 0;
        list_for_each(&sub->instrs, instr) {
            switch (instr->type) {
            case THECL_INSTR_TIME:
                fprintf(out, "+%u: //%u\n", instr->time - time_last, instr->time);
                time_last = instr->time;
                break;
            case THECL_INSTR_RANK:
                if(instr->rank == 0xFF) fprintf(out, "!*");
                else if(instr->rank == get_default_none_rank(ecl->version)) fprintf(out, "!-");
                else {
                    fprintf(out, "!%s%s%s%s%s%s%s%s",
                        (instr->rank) & RANK_EASY    ? "E" : "",
                        (instr->rank) & RANK_NORMAL  ? "N" : "",
                        (instr->rank) & RANK_HARD    ? "H" : "",
                        (instr->rank) & RANK_LUNATIC ? "L" : "",
                        !((instr->rank) & RANK_ID_4) ? "4" : "",
                        !((instr->rank) & RANK_ID_5) ? "5" : "",
                        !((instr->rank) & RANK_ID_6) ? "6" : "",
                        !((instr->rank) & RANK_ID_7) ? "7" : "");
                }
                break;
            case THECL_INSTR_LABEL:
                fprintf(out, "%s_%u:\n", sub->name, instr->offset);
                break;
            case THECL_INSTR_INSTR: {
                if (g_ecl_hexdebug) {
                    fprintf(out, "    /* %5x (+%5x) */ ", instr->address, instr->offset);
                } else {
                    fprintf(out, "    ");
                }
                seqmap_entry_t *ent = seqmap_get(g_eclmap->ins_names, instr->id);
                if (ent) {
                    fprintf(out, "%s(", ent->value);
                } else {
                    fprintf(out, "ins_%u(", instr->id);
                }
                thecl_param_t* param;
                int first = 1;
                list_for_each(&instr->params, param) {
                    if (!first) {
                        fprintf(out, ", ");
                    } else {
                        first = 0;
                    }

                    char* ret = th06_stringify_param(sub, instr, param, ecl->version);
                    fprintf(out, "%s", ret);
                    free(ret);
                }
                fprintf(out, ");\n");
                break;
            }
            default:
                abort();
            }
        }

        fprintf(out, "}\n");
    }

    thecl_timeline_t* timeline;
    list_for_each(&ecl->timelines, timeline) {
        fprintf(out, "\ntimeline %s()\n{\n", timeline->name);
        thecl_instr_t* instr;
        unsigned int time_last = 0;
        list_for_each(&timeline->instrs, instr) {
            switch(instr->type) {
            case THECL_INSTR_TIME:
                if (instr->time != 0xffff) /* The last ins has to always be 0xffff, so let's not make it relative... */
                    fprintf(out, "+%u: //%u\n", instr->time - time_last, instr->time);
                else
                    fprintf(out, "%u:\n", instr->time);
                time_last = instr->time;
                break;
            case THECL_INSTR_RANK:
                if(instr->rank == 0xFF) fprintf(out, "!*\n");
                else if(instr->rank == 0xF0) fprintf(out, "!-\n");
                else {
                    fprintf(out, "!%s%s%s%s%s%s%s%s\n",
                        (instr->rank) & RANK_EASY    ? "E" : "",
                        (instr->rank) & RANK_NORMAL  ? "N" : "",
                        (instr->rank) & RANK_HARD    ? "H" : "",
                        (instr->rank) & RANK_LUNATIC ? "L" : "",
                        !((instr->rank) & RANK_ID_4) ? "4" : "",
                        !((instr->rank) & RANK_ID_5) ? "5" : "",
                        !((instr->rank) & RANK_ID_6) ? "6" : "",
                        !((instr->rank) & RANK_ID_7) ? "7" : "");
                }
                break;
            case THECL_INSTR_INSTR: {
                seqmap_entry_t *ent = seqmap_get(g_eclmap->timeline_ins_names, instr->id);
                if (ent)
                    fprintf(out, "    %s(", ent->value);
                else
                    fprintf(out, "    ins_%u(", instr->id);

                int first = 1;
                thecl_param_t* param;
                list_for_each(&instr->params, param) {
                    if (!first) {
                        fprintf(out, ", ");
                    } else {
                        first = 0;
                    }

                    char* ret = th06_stringify_param(NULL, instr, param, ecl->version);
                    fprintf(out, "%s", ret);
                    free(ret);
                }
                fprintf(out, ");\n");
                break;
            }
            default:
                abort();
            }
        }
        fprintf(out, "}\n");
    }
}